

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_base_swaps<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
               (void)

{
  template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
  *this;
  Dimension DVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  Field_operators *pFVar8;
  Entry_constructor *pEVar9;
  Entry_constructor *pEVar10;
  Column_settings *pCVar11;
  Column_settings *pCVar12;
  pointer pIVar13;
  pointer pIVar14;
  ulong uVar15;
  undefined8 uVar16;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_> m;
  uint local_194 [3];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_188;
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>
  local_170;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>>
            ();
  local_170.colSettings_ = (Column_settings *)operator_new(0x38);
  (((Entry_constructor *)
   &((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->
    super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->list).ptr =
       (char *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->list).sz = 0;
  ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->requested_size = 0x18
  ;
  ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->next_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->start_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->max_size = 0;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
  ::Boundary_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
              *)&local_170.matrix_,&local_188,local_170.colSettings_);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
            (&local_188,&local_170);
  pIVar13 = local_170.matrix_.matrix_.
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar15 = ((long)local_170.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_170.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  if (uVar15 < 4) {
    uVar16 = 3;
  }
  else {
    uVar16 = 5;
    if (5 < uVar15) {
      DVar1 = local_170.matrix_.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].super_Column_dimension_option.dim_;
      local_170.matrix_.matrix_.
      super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[3].super_Column_dimension_option.dim_ =
           local_170.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_;
      local_170.matrix_.matrix_.
      super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_ = DVar1;
      boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
      swap_nodes((node_ptr)
                 &local_170.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[3].column_,
                 (node_ptr)
                 &local_170.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[5].column_);
      pIVar14 = local_170.matrix_.matrix_.
                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar8 = pIVar13[3].operators_;
      pEVar9 = pIVar13[3].entryPool_;
      pEVar10 = pIVar13[5].entryPool_;
      pIVar13[3].operators_ = pIVar13[5].operators_;
      pIVar13[3].entryPool_ = pEVar10;
      pIVar13[5].operators_ = pFVar8;
      pIVar13[5].entryPool_ = pEVar9;
      if (5 < (ulong)(((long)local_170.matrix_.matrix_.
                             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_170.matrix_.matrix_.
                             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))
      {
        DVar1 = local_170.matrix_.matrix_.
                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_;
        local_170.matrix_.matrix_.
        super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_ =
             local_170.matrix_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].super_Column_dimension_option.dim_;
        local_170.matrix_.matrix_.
        super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].super_Column_dimension_option.dim_ = DVar1;
        boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
        swap_nodes((node_ptr)
                   &local_170.matrix_.matrix_.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].column_,
                   (node_ptr)
                   &local_170.matrix_.matrix_.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].column_);
        pEVar9 = pIVar14[1].entryPool_;
        pFVar8 = pIVar14[5].operators_;
        pEVar10 = pIVar14[5].entryPool_;
        pIVar14[5].operators_ = pIVar14[1].operators_;
        pIVar14[5].entryPool_ = pEVar9;
        pIVar14[1].operators_ = pFVar8;
        pIVar14[1].entryPool_ = pEVar10;
        puVar4 = local_188.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar5 = local_188.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar6 = local_188.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        local_188.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_188.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_188.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_188.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_188.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_188.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        puVar7 = local_188.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_188.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_188.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_188.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar7;
        local_188.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_188.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_188.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = puVar4;
        local_188.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5;
        local_188.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar6;
        test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
                  (&local_188,&local_170);
        this = &local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
        ;
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowSwapped_ = true;
        uVar15 = (long)local_170.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_170.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        if (uVar15 < 6) {
          do {
            local_194[0] = (uint)uVar15;
            if (local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&this->indexToRow_,
                         (iterator)
                         local_170.matrix_.
                         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                         .indexToRow_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_194);
            }
            else {
              *local_170.matrix_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
               .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = (uint)uVar15;
              local_170.matrix_.
              super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
              .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_170.matrix_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != 6);
        }
        uVar2 = local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[5];
        uVar3 = local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start
                [local_170.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[3]];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start
        [local_170.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
         .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[3]] =
             local_170.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
             .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar2];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] = uVar3;
        uVar2 = local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[3];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[3] =
             local_170.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
             .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[5];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[5] = uVar2;
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowSwapped_ = true;
        uVar15 = (long)local_170.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_170.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        if (uVar15 < 6) {
          do {
            local_194[0] = (uint)uVar15;
            if (local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&this->indexToRow_,
                         (iterator)
                         local_170.matrix_.
                         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                         .indexToRow_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_194);
            }
            else {
              *local_170.matrix_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
               .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = (uint)uVar15;
              local_170.matrix_.
              super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
              .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_170.matrix_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != 6);
        }
        uVar2 = local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[1];
        uVar3 = local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start
                [local_170.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[5]];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start
        [local_170.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
         .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[5]] =
             local_170.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
             .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar2];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] = uVar3;
        uVar2 = local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[5];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[5] =
             local_170.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
             .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[1] = uVar2;
        local_194[0] = 2;
        local_194[1] = 5;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   (local_188.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4),local_194);
        local_194[0] = 1;
        local_194[1] = 3;
        local_194[2] = 4;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   (local_188.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 6),local_194);
        local_194[0] = 0;
        local_194[1] = 5;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   (local_188.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1),local_194);
        test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
                  (&local_188,&local_170);
        pCVar11 = local_170.colSettings_;
        std::
        vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
        ::_M_erase_at_end(&local_170.matrix_.matrix_,
                          local_170.matrix_.matrix_.
                          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        pCVar12 = local_170.colSettings_;
        local_170.matrix_.nextInsertIndex_ = 0;
        local_170.matrix_.colSettings_ = pCVar11;
        if ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_ !=
            (pool<boost::default_user_allocator_malloc_free> *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
                    ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_);
          operator_delete(pCVar12,0x38);
        }
        Gudhi::persistence_matrix::
        Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>
        ::~Boundary_matrix(&local_170.matrix_);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_188);
        return;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar16);
}

Assistant:

void test_base_swaps() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.swap_columns(3, 5);
  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    m.swap_columns(3, 1);
  } else {
    m.swap_columns(5, 1);
    columns[3].swap(columns[5]);
    columns[5].swap(columns[1]);
  }

  test_content_equality(columns, m);

  m.swap_rows(3, 5);
  m.swap_rows(5, 1);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[4] = {2, 5};
    columns[6] = {1, 3, 4};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {0, 5};
      columns[5] = {0, 2};
    } else {
      columns[1] = {0, 5};
    }
  } else {
    columns[4] = {{2, 4}, {5, 1}};
    columns[6] = {{1, 1}, {3, 4}, {4, 1}};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {{0, 1}, {5, 4}};
      columns[5] = {{0, 1}, {2, 4}};
    } else {
      columns[1] = {{0, 1}, {5, 4}};
    }
  }

  test_content_equality(columns, m);
}